

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  rc_data *prVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 in_XMM4_Qb;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  lVar5 = 0;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
    auVar9._8_8_ = 0x7fffffffffffffff;
    auVar9._0_8_ = 0x7fffffffffffffff;
    piVar3 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    auVar6 = ZEXT816(0) << 0x40;
    while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
           local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl) {
      iVar2 = *local_38._M_head_impl;
      piVar1 = local_38._M_head_impl + 1;
      local_38._M_head_impl = local_38._M_head_impl + 2;
      auVar7._0_8_ = (double)piVar3[iVar2];
      auVar7._8_8_ = in_XMM4_Qb;
      auVar7 = vandpd_avx(auVar7,auVar9);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[*piVar1] +
                     (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                     _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar2];
      auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar8);
    }
    prVar4 = (this->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
             ._M_head_impl;
    prVar4[lVar5].id = (int)lVar5;
    prVar4[lVar5].f = piVar3[begin->value];
    prVar4[lVar5].value =
         (this->c->linear_elements)._M_t.
         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl[begin->column] - auVar6._0_8_;
    lVar5 = lVar5 + 1;
  }
  return (int)lVar5;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }